

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeNumber(ExpressionContext *ctx,SynNumber *syntax)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  ExprBase *pEVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *extraout_RAX;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  TypeBase *pTVar11;
  char *pcVar12;
  char *pos;
  SynNumber *rhs;
  undefined8 uVar13;
  char *in_R9;
  __va_list_tag _Stack_120;
  undefined1 auStack_100 [32];
  undefined8 uStack_e0;
  char *pcStack_d8;
  code *pcStack_50;
  _func_int **local_40;
  undefined1 local_38 [16];
  undefined4 extraout_var;
  
  pcVar10 = (syntax->value).begin;
  uVar4 = (long)(syntax->value).end - (long)pcVar10;
  uVar3 = (uint)uVar4;
  if (uVar3 < 2) {
    if (uVar3 != 0) goto LAB_001699f8;
LAB_00169ac6:
    local_38._0_8_ = "b";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x169aec;
    bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
    if (bVar1) {
      pcVar12 = (syntax->value).begin;
      uVar3 = 0;
      do {
        uVar7 = uVar3;
        uVar3 = uVar7 + 1;
      } while (pcVar12[uVar7] == '0');
      pcVar10 = (syntax->value).end;
      if (0x40 < (int)((((int)pcVar10 - (int)pcVar12) - (uVar7 + 1)) + 1)) {
        pcStack_50 = (code *)0x169b27;
        anon_unknown.dwarf_c3752::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar12,"ERROR: overflow in binary constant");
        pcVar12 = (syntax->value).begin;
        pcVar10 = (syntax->value).end;
      }
      pcVar12 = pcVar12 + uVar7;
      iVar2 = 2;
    }
    else {
      local_38._0_8_ = "l";
      local_38._8_8_ = "";
      pcStack_50 = (code *)0x169b87;
      bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
      if (bVar1) {
        pcVar10 = (syntax->value).end;
        uVar13 = 10;
        pcStack_50 = (code *)0x169ba8;
        pp_Var5 = (_func_int **)
                  anon_unknown.dwarf_c3752::ParseLong
                            (ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar10,10);
        if ((long)pp_Var5 < 0) {
LAB_00169d64:
          pcStack_50 = anon_unknown.dwarf_c3752::ReportAt;
          anon_unknown.dwarf_c3752::StopAt(ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar10)
          ;
          _Stack_120.reg_save_area = auStack_100;
          _Stack_120.overflow_arg_area = &local_40;
          _Stack_120.gp_offset = 0x20;
          _Stack_120.fp_offset = 0x30;
          uStack_e0 = uVar13;
          pcStack_d8 = in_R9;
          anon_unknown.dwarf_c3752::ReportAt(ctx,&syntax->super_SynBase,pos,pcVar10,&_Stack_120);
          return extraout_RAX;
        }
        pcStack_50 = (code *)0x169bc6;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
        goto LAB_00169bc6;
      }
      pcVar10 = (syntax->suffix).begin;
      pcVar12 = (syntax->suffix).end;
      if (pcVar10 != pcVar12) {
        pcStack_50 = (code *)0x169c7d;
        anon_unknown.dwarf_c3752::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar10,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar12 - (int)pcVar10));
        in_R9 = pcVar10;
      }
      pcVar12 = (syntax->value).begin;
      pcVar10 = (syntax->value).end;
      if ((((uint)((int)pcVar10 - (int)pcVar12) < 2) || (*pcVar12 != '0')) ||
         (9 < (byte)(pcVar12[1] - 0x30U))) {
        uVar13 = 10;
        pcStack_50 = (code *)0x169d0a;
        pp_Var5 = (_func_int **)
                  anon_unknown.dwarf_c3752::ParseLong(ctx,&syntax->super_SynBase,pcVar12,pcVar10,10)
        ;
        if ((_func_int **)(long)(int)pp_Var5 != pp_Var5) goto LAB_00169d64;
        pcStack_50 = (code *)0x169d27;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_04,iVar2);
        goto LAB_00169d27;
      }
      uVar3 = 0;
      do {
        uVar4 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (pcVar12[uVar4] == '0');
      iVar2 = (int)pcVar10 - (int)pcVar12;
      if ((0x16 < (int)((iVar2 - uVar3) + 1)) ||
         ((iVar2 - 0x15U == uVar3 && (pcVar12[uVar4] != '1')))) {
        pcStack_50 = (code *)0x169ce0;
        anon_unknown.dwarf_c3752::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar12,"ERROR: overflow in octal constant");
        pcVar12 = (syntax->value).begin;
        pcVar10 = (syntax->value).end;
      }
      iVar2 = 8;
    }
    pcStack_50 = (code *)0x169b43;
    pp_Var5 = (_func_int **)
              anon_unknown.dwarf_c3752::ParseLong(ctx,&syntax->super_SynBase,pcVar12,pcVar10,iVar2);
    pcStack_50 = (code *)0x169b5b;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    if ((_func_int **)(long)(int)pp_Var5 == pp_Var5) {
LAB_00169d27:
      pTVar11 = ctx->typeInt;
      goto LAB_00169d2e;
    }
  }
  else {
    if (pcVar10[1] != 'x') {
LAB_001699f8:
      uVar4 = uVar4 & 0xffffffff;
      bVar1 = false;
      uVar9 = 0;
      do {
        while( true ) {
          uVar8 = uVar9 + 1;
          if ((pcVar10[uVar9] != '.') && (pcVar10[uVar9] != 'e')) break;
          bVar1 = true;
          uVar9 = uVar8;
          if (uVar8 == uVar4) {
LAB_00169a3c:
            rhs = (SynNumber *)local_38;
            local_38._0_8_ = "f";
            local_38._8_8_ = "";
            pcStack_50 = (code *)0x169a5f;
            bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)rhs);
            if (bVar1) {
              pcStack_50 = (code *)0x169a70;
              local_40 = (_func_int **)
                         anon_unknown.dwarf_c3752::ParseDouble
                                   ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
              pcStack_50 = (code *)0x169a88;
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
              pTVar11 = ctx->typeFloat;
              local_40 = (_func_int **)(double)(float)(double)local_40;
              pEVar6->typeID = 7;
              pEVar6->source = &syntax->super_SynBase;
              pEVar6->type = pTVar11;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240538;
            }
            else {
              pcVar10 = (syntax->suffix).begin;
              pcVar12 = (syntax->suffix).end;
              if (pcVar10 != pcVar12) {
                pcStack_50 = (code *)0x169bf9;
                rhs = syntax;
                anon_unknown.dwarf_c3752::ReportAt
                          (ctx,&syntax->super_SynBase,pcVar10,
                           "ERROR: unknown number suffix \'%.*s\'",
                           (ulong)(uint)((int)pcVar12 - (int)pcVar10),pcVar10);
              }
              pcStack_50 = (code *)0x169c02;
              local_40 = (_func_int **)
                         anon_unknown.dwarf_c3752::ParseDouble
                                   ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
              pcStack_50 = (code *)0x169c1a;
              iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar6 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
              pTVar11 = ctx->typeDouble;
              pEVar6->typeID = 7;
              pEVar6->source = &syntax->super_SynBase;
              pEVar6->type = pTVar11;
              pEVar6->next = (ExprBase *)0x0;
              pEVar6->listed = false;
              pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240538;
            }
            pEVar6[1]._vptr_ExprBase = local_40;
            return pEVar6;
          }
        }
        uVar9 = uVar8;
      } while (uVar8 != uVar4);
      if (!bVar1) goto LAB_00169ac6;
      goto LAB_00169a3c;
    }
    if (uVar3 == 2) {
      pcStack_50 = (code *)0x16991a;
      anon_unknown.dwarf_c3752::ReportAt
                (ctx,&syntax->super_SynBase,pcVar10 + 2,"ERROR: \'0x\' must be followed by number");
    }
    local_38._0_8_ = "l";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x16993d;
    bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
    if (!bVar1) {
      pcVar10 = (syntax->suffix).begin;
      pcVar12 = (syntax->suffix).end;
      if (pcVar10 != pcVar12) {
        pcStack_50 = (code *)0x16996a;
        anon_unknown.dwarf_c3752::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar10,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar12 - (int)pcVar10),pcVar10);
      }
    }
    pcVar10 = (syntax->value).begin;
    iVar2 = (int)pcVar10 + 1;
    uVar3 = 2;
    do {
      uVar7 = uVar3;
      iVar2 = iVar2 + 1;
      uVar3 = uVar7 + 1;
    } while (pcVar10[uVar7] == '0');
    pcVar12 = (syntax->value).end;
    if (0x10 < (int)pcVar12 - iVar2) {
      pcStack_50 = (code *)0x1699a5;
      anon_unknown.dwarf_c3752::ReportAt
                (ctx,&syntax->super_SynBase,pcVar10,"ERROR: overflow in hexadecimal constant");
      pcVar10 = (syntax->value).begin;
      pcVar12 = (syntax->value).end;
    }
    pcStack_50 = (code *)0x1699c1;
    pp_Var5 = (_func_int **)
              anon_unknown.dwarf_c3752::ParseLong
                        (ctx,&syntax->super_SynBase,pcVar10 + uVar7,pcVar12,0x10);
    pcStack_50 = (code *)0x1699e2;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    if (!bVar1 && (_func_int **)(long)(int)pp_Var5 == pp_Var5) goto LAB_00169d27;
  }
LAB_00169bc6:
  pTVar11 = ctx->typeLong;
LAB_00169d2e:
  pEVar6->typeID = 6;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = pTVar11;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
  pEVar6[1]._vptr_ExprBase = pp_Var5;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeNumber(ExpressionContext &ctx, SynNumber *syntax)
{
	InplaceStr &value = syntax->value;

	// Hexadecimal
	if(value.length() > 1 && value.begin[1] == 'x')
	{
		if(value.length() == 2)
			ReportAt(ctx, syntax, value.begin + 2, "ERROR: '0x' must be followed by number");

		bool forceLong = false;

		if(syntax->suffix == InplaceStr("l"))
			forceLong = true;
		else if(!syntax->suffix.empty())
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);

		// Skip 0x
		unsigned pos = 2;

		// Skip leading zeros
		while(value.begin[pos] == '0')
			pos++;

		if(int(value.length() - pos) > 16)
			ReportAt(ctx, syntax, value.begin, "ERROR: overflow in hexadecimal constant");

		long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 16);

		// If number overflows integer number, create long number
		if(!forceLong && int(num) == num)
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
	}

	bool isFP = false;

	for(unsigned i = 0; i < value.length(); i++)
	{
		if(value.begin[i] == '.' || value.begin[i] == 'e')
			isFP = true;
	}

	if(!isFP)
	{
		if(syntax->suffix == InplaceStr("b"))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 64)
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in binary constant");

			long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 2);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}
		else if(syntax->suffix == InplaceStr("l"))
		{
			unsigned long long num = ParseLong(ctx, syntax, value.begin, value.end, 10);

			if(num > 9223372036854775807ull)
				StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, (long long)num);
		}
		else if(!syntax->suffix.empty())
		{
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
		}

		if(value.length() > 1 && value.begin[0] == '0' && isDigit(value.begin[1]))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 22 || (int(value.length() - pos) > 21 && value.begin[pos] != '1'))
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in octal constant");

			long long num = (long long)ParseLong(ctx,syntax,  value.begin, value.end, 8);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}

		long long num = (long long)ParseLong(ctx, syntax, value.begin, value.end, 10);

		if(int(num) != num)
			StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);
	}

	if(syntax->suffix == InplaceStr("f"))
	{
		double num = ParseDouble(ctx, value.begin);

		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeFloat, float(num));
	}
	else if(!syntax->suffix.empty())
	{
		ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
	}

	double num = ParseDouble(ctx, value.begin);

	return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeDouble, num);
}